

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choicfmt.cpp
# Opt level: O0

int32_t icu_63::ChoiceFormat::matchStringUntilLimitPart
                  (MessagePattern *pattern,int32_t partIndex,int32_t limitPartIndex,
                  UnicodeString *source,int32_t sourceOffset)

{
  int8_t iVar1;
  UMessagePatternPartType UVar2;
  int32_t iVar3;
  int _length;
  UnicodeString *srcText;
  Part *pPVar4;
  int32_t length;
  int32_t index;
  Part *part;
  int32_t prevIndex;
  UnicodeString *msgString;
  int32_t matchingSourceLength;
  int32_t sourceOffset_local;
  UnicodeString *source_local;
  int32_t limitPartIndex_local;
  int32_t partIndex_local;
  MessagePattern *pattern_local;
  
  msgString._0_4_ = 0;
  srcText = MessagePattern::getPatternString(pattern);
  pPVar4 = MessagePattern::getPart(pattern,partIndex);
  part._4_4_ = MessagePattern::Part::getLimit(pPVar4);
  source_local._4_4_ = partIndex;
LAB_003772d5:
  source_local._4_4_ = source_local._4_4_ + 1;
  pPVar4 = MessagePattern::getPart(pattern,source_local._4_4_);
  if (source_local._4_4_ != limitPartIndex) goto code_r0x003772f3;
  goto LAB_00377301;
code_r0x003772f3:
  UVar2 = MessagePattern::Part::getType(pPVar4);
  if (UVar2 == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
LAB_00377301:
    iVar3 = MessagePattern::Part::getIndex(pPVar4);
    _length = iVar3 - part._4_4_;
    if ((_length != 0) &&
       (iVar1 = icu_63::UnicodeString::compare
                          (source,sourceOffset,_length,srcText,part._4_4_,_length), iVar1 != '\0'))
    {
      return -1;
    }
    msgString._0_4_ = _length + (int)msgString;
    if (source_local._4_4_ == limitPartIndex) {
      return (int)msgString;
    }
    part._4_4_ = MessagePattern::Part::getLimit(pPVar4);
  }
  goto LAB_003772d5;
}

Assistant:

int32_t
ChoiceFormat::matchStringUntilLimitPart(
        const MessagePattern &pattern, int32_t partIndex, int32_t limitPartIndex,
        const UnicodeString &source, int32_t sourceOffset) {
    int32_t matchingSourceLength = 0;
    const UnicodeString &msgString = pattern.getPatternString();
    int32_t prevIndex = pattern.getPart(partIndex).getLimit();
    for (;;) {
        const MessagePattern::Part &part = pattern.getPart(++partIndex);
        if (partIndex == limitPartIndex || part.getType() == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
            int32_t index = part.getIndex();
            int32_t length = index - prevIndex;
            if (length != 0 && 0 != source.compare(sourceOffset, length, msgString, prevIndex, length)) {
                return -1;  // mismatch
            }
            matchingSourceLength += length;
            if (partIndex == limitPartIndex) {
                return matchingSourceLength;
            }
            prevIndex = part.getLimit();  // SKIP_SYNTAX
        }
    }
}